

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O0

void __thiscall
CompositedBupOutputter::setBase(CompositedBupOutputter *this,path *basePath,Image *img,string *name)

{
  path *in_RCX;
  Image *in_RDX;
  path *in_RDI;
  
  std::filesystem::__cxx11::path::operator=(in_RDI,in_RCX);
  Image::operator=((Image *)in_RCX,in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 2),(string *)in_RCX);
  std::__cxx11::string::operator=((string *)(in_RDI[3]._M_pathname.field_2._M_local_buf + 8),"");
  std::__cxx11::string::operator=((string *)&in_RDI[5]._M_pathname._M_string_length,"");
  return;
}

Assistant:

void setBase(fs::path basePath, Image img, std::string name) override {
		this->basePath = std::move(basePath);
		base = std::move(img);
		baseName = std::move(name);
		withFaceName = "";
		withMouthName = "";
	}